

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O0

LogConfig * __thiscall duckdb::NopLogger::GetConfig(NopLogger *this)

{
  InternalException *this_00;
  string *in_stack_ffffffffffffffa8;
  allocator aStack_29;
  string asStack_28 [40];
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(asStack_28,"Called GetConfig on NopLogger",&aStack_29);
  InternalException::InternalException(this_00,in_stack_ffffffffffffffa8);
  __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

const LogConfig &GetConfig() const override {
		throw InternalException("Called GetConfig on NopLogger");
	}